

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.cpp
# Opt level: O0

void chai_procs(ChaiScript *chai)

{
  ChaiScript *in_RDI;
  anon_class_1_0_00000001_for_m_f *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *in_stack_fffffffffffffd98;
  allocator *t_t;
  ChaiScript *in_stack_fffffffffffffda0;
  ChaiScript *this;
  offset_in_ProcMap_to_subr in_stack_fffffffffffffdb0;
  ChaiScript *t_func;
  allocator local_1f9;
  string local_1f8 [32];
  code *local_1d8;
  undefined8 local_1d0;
  allocator local_1b1;
  string local_1b0 [63];
  allocator local_171;
  string local_170 [32];
  code *local_150;
  undefined8 local_148;
  allocator local_129;
  string local_128 [32];
  code *local_108;
  undefined8 local_100;
  allocator local_e1;
  string local_e0 [32];
  code *local_c0;
  undefined8 local_b8;
  allocator local_99;
  string local_98 [32];
  code *local_78;
  undefined8 local_70;
  allocator local_41;
  string local_40 [56];
  ChaiScript *local_8;
  
  local_8 = in_RDI;
  chaiscript::fun<chai_procs(chaiscript::ChaiScript&)::__0>
            ((anon_class_1_0_00000001_for_m_f *)in_stack_fffffffffffffd88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"ProcMap",&local_41);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x30c9b1);
  local_78 = henson::ProcMap::group_abi_cxx11_;
  local_70 = 0;
  chaiscript::fun<std::__cxx11::string,henson::ProcMap>(in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"group",&local_99);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x30ca66);
  local_c0 = henson::ProcMap::color;
  local_b8 = 0;
  chaiscript::fun<int,henson::ProcMap>(in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"color",&local_e1);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x30cb1b);
  local_108 = henson::ProcMap::world_rank;
  local_100 = 0;
  chaiscript::fun<int,henson::ProcMap>(in_stack_fffffffffffffdb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"world_rank",&local_129);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x30cbd0);
  local_150 = henson::ProcMap::local_rank;
  local_148 = 0;
  t_func = local_8;
  chaiscript::fun<int,henson::ProcMap>((offset_in_ProcMap_to_subr)local_8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"local_rank",&local_171);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x30cc85);
  this = local_8;
  chaiscript::fun<chai_procs(chaiscript::ChaiScript&)::__1>(in_stack_fffffffffffffd88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"intercomm",&local_1b1);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (this,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x30cd17);
  local_1d8 = henson::ProcMap::size;
  local_1d0 = 0;
  chaiscript::fun<int,henson::ProcMap,std::__cxx11::string_const&>
            ((offset_in_ProcMap_to_subr)t_func);
  t_t = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"size",t_t);
  chaiscript::ChaiScript::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (this,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)t_t,(string *)local_8);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x30cdc6);
  return;
}

Assistant:

void chai_procs(chaiscript::ChaiScript& chai)
{
    // ProcMap
    chai.add(chaiscript::fun([]() { return proc_map; }),                    "ProcMap");
    chai.add(chaiscript::fun(&h::ProcMap::group),                           "group");
    chai.add(chaiscript::fun(&h::ProcMap::color),                           "color");
    chai.add(chaiscript::fun(&h::ProcMap::world_rank),                      "world_rank");
    chai.add(chaiscript::fun(&h::ProcMap::local_rank),                      "local_rank");
    chai.add(chaiscript::fun([](h::ProcMap* pm, std::string to)
                             { pm->intercomm(to); }),                       "intercomm");
    chai.add(chaiscript::fun(&h::ProcMap::size),                            "size");
}